

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemomesh.cc
# Opt level: O3

void lecturedemo::scanTopology(Mesh *mesh,dim_t codim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  Entity *entity;
  undefined1 uVar4;
  uint uVar5;
  int iVar6;
  dim_t dVar7;
  undefined4 extraout_var;
  ostream *poVar9;
  long extraout_RDX;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  RefEl ref_el;
  stringstream ss;
  string local_248;
  Mesh *local_228;
  string local_220;
  string local_200;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  long *local_1d0;
  ulong local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  undefined8 *puVar8;
  
  uVar5 = (**mesh->_vptr_Mesh)();
  if (codim <= uVar5) {
    iVar6 = (*mesh->_vptr_Mesh[2])(mesh,(ulong)codim);
    puVar8 = (undefined8 *)CONCAT44(extraout_var,iVar6);
    if (extraout_RDX != 0) {
      local_1e0 = puVar8 + extraout_RDX;
      local_228 = mesh;
      do {
        plVar3 = (long *)*puVar8;
        uVar4 = (**(code **)(*plVar3 + 0x20))(plVar3);
        local_248._M_dataplus._M_p._0_1_ = uVar4;
        local_1d0 = plVar3;
        (*mesh->_vptr_Mesh[5])(mesh,plVar3);
        lf::base::RefEl::ToString_abi_cxx11_((string *)local_1b8,(RefEl *)&local_248);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        local_1d8 = puVar8;
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                          local_1a8[0]._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": idx = ",8);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        local_1b8[0] = (stringstream)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_1b8,1);
        dVar7 = (**mesh->_vptr_Mesh)(mesh);
        if (dVar7 != codim) {
          uVar5 = 1;
          do {
            auVar12 = (**(code **)(*local_1d0 + 8))(local_1d0,uVar5);
            if (auVar12._8_8_ != 0) {
              local_1c8 = (ulong)uVar5;
              lVar10 = auVar12._8_8_ << 3;
              lVar11 = 0;
              local_1c0 = auVar12._0_8_;
              do {
                entity = *(Entity **)(local_1c0 + lVar11 * 8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\t rel. codim ",0xd);
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," sub-ent ",9);
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
                poVar9 = lf::mesh::operator<<(poVar9,entity);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", idx = ",8);
                (*local_228->_vptr_Mesh[5])(local_228,entity);
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                local_1b8[0] = (stringstream)0xa;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_1b8,1);
                lVar11 = lVar11 + 1;
                lVar10 = lVar10 + -8;
              } while (lVar10 != 0);
            }
            mesh = local_228;
            uVar5 = uVar5 + 1;
            iVar6 = (**local_228->_vptr_Mesh)(local_228);
          } while (uVar5 <= iVar6 - codim);
        }
        puVar8 = local_1d8 + 1;
      } while (puVar8 != local_1e0);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"codim ",6);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," too large",10);
  paVar1 = &local_248.field_2;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"(codim <= mesh.DimMesh())","");
  paVar2 = &local_220.field_2;
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed(&local_248,&local_220,0x41,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"false","");
  local_220._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/lecturedemos/lecturedemomesh.cc"
             ,"");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  lf::base::AssertionFailed(&local_248,&local_220,0x41,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_248);
  abort();
}

Assistant:

void scanTopology(const lf::mesh::Mesh &mesh, dim_t codim) {
  LF_ASSERT_MSG((codim <= mesh.DimMesh()),
		"codim " << +codim << " too large");
  // loop over all entities of the specified codimension
  for (const lf::mesh::Entity* ent : mesh.Entities(codim)) {
    // Fetch topology type (TRIA or QUAD so far)
    const lf::base::RefEl ref_el{ent->RefEl()};
    // Print topological type and global index of the ent
    const glb_idx_t ent_idx = mesh.Index(*ent);
    std::cout << ref_el << ": idx = " << ent_idx << '\n';
    // Inspect sub-entities of any co-dimension
    for (dim_t sub_codim = 1; sub_codim <= mesh.DimMesh() - codim;
         ++sub_codim) {
      // Obtain iterator over sub-entities
      const std::span<const lf::mesh::Entity* const>
	sub_ent_range { ent->SubEntities(sub_codim) };
      size_type sub_cnt = 0;  // Counter for sub-entities
      // Loop over sub-entities, whose types and indices will be output
      for (const lf::mesh::Entity* subent : sub_ent_range) { // \Label[line]{st:1}
        std::cout << "\t rel. codim " << +sub_codim << " sub-ent "
		  << sub_cnt << ": " << *subent << ", idx = "
		  << mesh.Index(*subent) << '\n';
        sub_cnt++;
      }}}}